

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

void EDLines::UpdateLineParameters(LineSegment *ls)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = ls->sx;
  dVar1 = ls->sy;
  dVar3 = ls->ex - dVar2;
  dVar4 = ls->ey - dVar1;
  if (ABS(dVar4) <= ABS(dVar3)) {
    ls->invert = 0;
    if (0.001 <= ABS(dVar4)) {
      ls->b = dVar4 / dVar3;
      dVar3 = (dVar4 / dVar3) * dVar2;
      goto LAB_00118ac1;
    }
    ls->b = 0.0;
    dVar2 = ls->ey + dVar1;
  }
  else {
    ls->invert = 1;
    if (0.001 <= ABS(dVar3)) {
      ls->b = dVar3 / dVar4;
      dVar3 = dVar1 * (dVar3 / dVar4);
      dVar1 = dVar2;
LAB_00118ac1:
      dVar2 = dVar1 - dVar3;
      goto LAB_00118ac9;
    }
    ls->b = 0.0;
    dVar2 = ls->ex + dVar2;
  }
  dVar2 = dVar2 * 0.5;
LAB_00118ac9:
  ls->a = dVar2;
  return;
}

Assistant:

void EDLines::UpdateLineParameters(LineSegment * ls)
{
	double dx = ls->ex - ls->sx;
	double dy = ls->ey - ls->sy;

	if (fabs(dx) >= fabs(dy)) {
		/// Line will be of the form y = a + bx
		ls->invert = 0;
		if (fabs(dy) < 1e-3) { ls->b = 0; ls->a = (ls->sy + ls->ey) / 2; }
		else {
			ls->b = dy / dx;
			ls->a = ls->sy - (ls->b)*ls->sx;
		} //end-else

	}
	else {
		/// Line will be of the form x = a + by
		ls->invert = 1;
		if (fabs(dx) < 1e-3) { ls->b = 0; ls->a = (ls->sx + ls->ex) / 2; }
		else {
			ls->b = dx / dy;
			ls->a = ls->sx - (ls->b)*ls->sy;
		} //end-else
	} //end-else
}